

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

bool __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<bool>
          (Deserializer *this,field_id_t field_id,char *tag)

{
  undefined1 uVar1;
  uint uVar2;
  _func_int **pp_Var4;
  undefined6 in_register_00000032;
  int iVar3;
  
  uVar2 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  pp_Var4 = this->_vptr_Deserializer;
  if ((char)uVar2 == '\0') {
    uVar1 = 0;
  }
  else {
    iVar3 = (*pp_Var4[0xc])(this);
    uVar1 = (undefined1)iVar3;
    pp_Var4 = this->_vptr_Deserializer;
  }
  (*pp_Var4[5])(this,(ulong)(uVar2 & 0xff));
  return (bool)uVar1;
}

Assistant:

inline T ReadPropertyWithDefault(const field_id_t field_id, const char *tag) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(SerializationDefaultValue::GetDefault<T>());
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}